

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::TaskSet::add(TaskSet *this,Promise<void> *promise)

{
  Task *pTVar1;
  Task *pTVar2;
  PromiseBase node;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *head;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *pMVar3;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> task;
  Task *local_20;
  PromiseBase local_18;
  
  local_18.node.ptr = (OwnPromiseNode)(promise->super_PromiseBase).node.ptr;
  (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  kj::_::PromiseDisposer::appendPromise<kj::TaskSet::Task,kj::_::PromiseDisposer,kj::TaskSet&>
            ((PromiseDisposer *)&local_20,&local_18.node,this);
  node.node.ptr = local_18.node.ptr;
  if (local_18.node.ptr != (PromiseNode *)0x0) {
    local_18.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
  }
  pTVar1 = (this->tasks).ptr.ptr;
  pMVar3 = &this->tasks;
  if (pTVar1 != (Task *)0x0) {
    ((pMVar3->ptr).ptr)->prev = &local_20->next;
    pTVar2 = (local_20->next).ptr.ptr;
    (local_20->next).ptr.ptr = pTVar1;
    (pMVar3->ptr).ptr = (Task *)0x0;
    if (pTVar2 != (Task *)0x0) {
      kj::_::PromiseDisposer::dispose(&pTVar2->super_PromiseArenaMember);
    }
  }
  pTVar2 = local_20;
  local_20->prev = pMVar3;
  local_20 = (Task *)0x0;
  pTVar1 = (pMVar3->ptr).ptr;
  (pMVar3->ptr).ptr = pTVar2;
  if (pTVar1 != (Task *)0x0) {
    kj::_::PromiseDisposer::dispose(&pTVar1->super_PromiseArenaMember);
  }
  pTVar1 = local_20;
  if (local_20 != (Task *)0x0) {
    local_20 = (Task *)0x0;
    kj::_::PromiseDisposer::dispose(&pTVar1->super_PromiseArenaMember);
  }
  return;
}

Assistant:

void TaskSet::add(Promise<void>&& promise) {
  auto task = _::PromiseDisposer::appendPromise<Task>(_::PromiseNode::from(kj::mv(promise)), *this);
  KJ_IF_SOME(head, tasks) {
    head->prev = &task->next;
    task->next = kj::mv(tasks);
  }
  task->prev = &tasks;
  tasks = kj::mv(task);
}